

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

int append_to_zip(FILE *zip_file,file_sorted_t *filep,FILE *ozip,BYTE *odir)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  file_entry_t *pfVar5;
  file_sorted_t *pfVar6;
  FILE *ozip_00;
  uint uVar7;
  int iVar8;
  int iVar9;
  tm *time;
  FILE *pFVar10;
  ulong uVar11;
  void *__ptr;
  size_t sVar12;
  undefined8 uVar13;
  CentralDirectoryEntry *ent;
  code *pcVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  uint *puVar18;
  uint uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  uint comp_len [2];
  Byte *compbuf [2];
  int method [2];
  int offset [2];
  uint auStack_c8 [2];
  undefined1 *local_c0;
  file_sorted_t *local_b8;
  FILE *local_b0;
  uint local_a4;
  void *local_a0;
  void *local_98;
  file_entry_t *local_90;
  ulong local_88;
  FILE *local_80;
  void *local_78 [2];
  ulong local_68;
  int aiStack_60 [4];
  int local_50;
  undefined2 local_4c;
  short local_4a;
  short local_48;
  undefined4 local_46;
  uint local_42;
  uint local_3e;
  uint local_3a;
  undefined2 local_36;
  undefined2 local_34;
  
  pfVar5 = filep->file;
  time = localtime(&pfVar5->time_write);
  time_to_dos((tm *)time,&pfVar5->date,&pfVar5->time);
  pFVar10 = fopen(&pfVar5->field_0x26,"rb");
  if (pFVar10 == (FILE *)0x0) {
    append_to_zip_cold_1();
    return 1;
  }
  local_c0 = &pfVar5->field_0x26;
  local_b8 = filep;
  local_b0 = ozip;
  fseek(pFVar10,0,2);
  uVar11 = ftell(pFVar10);
  fseek(pFVar10,0,0);
  uVar19 = (uint)uVar11;
  uVar15 = uVar11 & 0xffffffff;
  __ptr = malloc(uVar15);
  if (__ptr == (void *)0x0) {
    fclose(pFVar10);
    fprintf(_stderr,"Could not allocate %u bytes\n",uVar11 & 0xffffffff);
    return 1;
  }
  local_88 = uVar15;
  local_80 = (FILE *)zip_file;
  sVar12 = fread(__ptr,1,uVar15,pFVar10);
  fclose(pFVar10);
  if ((uint)sVar12 != uVar19) {
    free(__ptr);
    pcVar17 = "Unable to read %s\n";
LAB_00104357:
    fprintf(_stderr,pcVar17,local_c0);
    return 1;
  }
  pfVar5->uncompressed_size = uVar19;
  pfVar5->compressed_size = uVar19;
  pfVar5->method = 0;
  uVar13 = crc32(0,0,0);
  uVar7 = crc32(uVar13,__ptr,uVar11 & 0xffffffff);
  ozip_00 = local_b0;
  pfVar6 = local_b8;
  pfVar5->crc32 = uVar7;
  if ((local_b0 != (FILE *)0x0 && odir != (BYTE *)0x0) &&
     (ent = find_file_in_zip(odir,local_b8->path_in_zip,uVar19,uVar7,0,0),
     ent != (CentralDirectoryEntry *)0x0)) {
    iVar8 = copy_zip_file((FILE *)local_80,pfVar5,ozip_00,ent);
    if (0 < iVar8) {
      free(__ptr);
      return 0;
    }
    if (iVar8 < 0) {
      free(__ptr);
      pcVar17 = "Unable to write %s to zip\n";
      goto LAB_00104357;
    }
  }
  local_90 = pfVar5;
  if (Quiet == 0) {
    pcVar17 = "Adding %-40s";
    if (ozip_00 != (FILE *)0x0) {
      pcVar17 = "Updating %-40s";
    }
    printf(pcVar17,pfVar6->path_in_zip);
  }
  UpdateCount = UpdateCount + 1;
  uVar15 = (ulong)(uVar19 - 1);
  local_b0 = (FILE *)uVar11;
  local_a0 = malloc(uVar15);
  local_78[0] = local_a0;
  local_68 = uVar15;
  local_98 = malloc(uVar15);
  local_78[1] = local_98;
  uVar19 = 0;
  local_a4 = 0xffffffff;
  pcVar14 = compress_lzma;
  lVar16 = 0x10;
  iVar8 = DeflateOnly;
  do {
    iVar9 = *(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar16);
    if ((iVar8 == 0) || (bVar20 = iVar9 == 8, iVar9 = 8, bVar20)) {
      puVar18 = auStack_c8 + uVar19;
      *puVar18 = (uint)local_68;
      aiStack_60[uVar19] = iVar9;
      iVar9 = (*pcVar14)(local_78[uVar19],puVar18,__ptr,local_b0);
      aiStack_60[(ulong)uVar19 + 2] = iVar9;
      iVar8 = DeflateOnly;
      if ((-1 < iVar9) && (((int)local_a4 < 0 || (*puVar18 <= auStack_c8[local_a4])))) {
        local_a4 = uVar19;
        uVar19 = uVar19 ^ 1;
      }
    }
    pFVar10 = local_80;
    uVar11 = local_88;
    pfVar5 = local_90;
    pfVar6 = local_b8;
    pcVar14 = *(code **)((long)&Compressors[0].compress + lVar16);
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x40);
  if ((int)local_a4 < 0) {
    local_48 = local_90->method;
    local_3e = local_90->compressed_size;
  }
  else {
    local_48 = (short)aiStack_60[local_a4];
    local_90->method = local_48;
    local_3e = auStack_c8[local_a4];
    local_90->compressed_size = local_3e;
  }
  local_50 = 0x4034b50;
  local_4c = 0x14;
  local_4a = (ushort)(local_48 == 8) * 2;
  uVar1 = local_90->date;
  uVar2 = local_90->time;
  uVar3 = local_90->method;
  uVar4 = *(undefined2 *)&local_90->field_0x26;
  auVar21._6_2_ = uVar4;
  auVar21._4_2_ = uVar3;
  auVar21._2_2_ = uVar2;
  auVar21._0_2_ = uVar1;
  auVar21._8_8_ = 0;
  auVar21 = pshuflw(auVar21,auVar21,0xe1);
  local_46 = auVar21._0_4_;
  local_42 = local_90->crc32;
  local_3a = local_90->uncompressed_size;
  sVar12 = strlen(local_b8->path_in_zip);
  local_36 = (undefined2)sVar12;
  local_34 = 0;
  lVar16 = ftell(pFVar10);
  pfVar5->zip_offset = (uint)lVar16;
  sVar12 = fwrite(aiStack_60 + 4,0x1e,1,pFVar10);
  if (sVar12 == 1) {
    pcVar17 = pfVar6->path_in_zip;
    sVar12 = strlen(pcVar17);
    sVar12 = fwrite(pcVar17,sVar12,1,pFVar10);
    if (sVar12 == 1) {
      if (pfVar5->method == 0) {
        sVar12 = fwrite(__ptr,1,uVar11,pFVar10);
        if (sVar12 == uVar11) goto LAB_00104203;
      }
      else {
        lVar16 = (long)(int)local_a4;
        sVar12 = fwrite((void *)((long)aiStack_60[lVar16 + 2] + (long)local_78[lVar16]),1,
                        (ulong)auStack_c8[lVar16],pFVar10);
        if (sVar12 == auStack_c8[lVar16]) {
LAB_00104203:
          free(__ptr);
          if (local_a0 != (void *)0x0) {
            free(local_a0);
          }
          if (local_98 != (void *)0x0) {
            free(local_98);
          }
          if (Quiet == 0) {
            uVar19 = pfVar5->compressed_size;
            uVar7 = pfVar5->uncompressed_size;
            pcVar17 = method_name((int)pfVar5->method);
            printf("%5.1f%% [%6u/%6u] %s\n",100.0 - ((double)uVar19 * 100.0) / (double)uVar7,
                   (ulong)uVar19,(ulong)uVar7,pcVar17);
            return 0;
          }
          return 0;
        }
      }
    }
  }
  if (Quiet == 0) {
    putchar(10);
  }
  fprintf(_stderr,"Unable to write %s to zip\n",local_c0);
  free(__ptr);
  if (local_a0 != (void *)0x0) {
    free(local_a0);
  }
  if (local_98 != (void *)0x0) {
    free(local_98);
    return 1;
  }
  return 1;
}

Assistant:

int append_to_zip(FILE *zip_file, file_sorted_t *filep, FILE *ozip, BYTE *odir)
{
	LocalFileHeader local;
	uLong crc;
	file_entry_t *file;
	Byte *readbuf;
	Byte *compbuf[2];
	unsigned int comp_len[2];
	int offset[2];
	int method[2];
	int best;
	int slot;
	FILE *lumpfile;
	unsigned int readlen;
	unsigned int len;
	int i;
	struct tm *ltime;

	file = filep->file;

	// try to determine local time
	ltime = localtime(&file->time_write);
	time_to_dos(ltime, &file->date, &file->time);

	// lumpfile = source file
	lumpfile = fopen(file->path, "rb");
	if (lumpfile == NULL)
	{
		fprintf(stderr, "Could not open %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	// len = source size
	fseek (lumpfile, 0, SEEK_END);
	len = ftell(lumpfile);
	fseek (lumpfile, 0, SEEK_SET);

	// allocate a buffer for the whole source file
	readbuf = malloc(len);
	if (readbuf == NULL)
	{
		fclose(lumpfile);
		fprintf(stderr, "Could not allocate %u bytes\n", (int)len);
		return 1;
	}
	// read the whole source file into buffer
	readlen = (unsigned int)fread(readbuf, 1, len, lumpfile);
	fclose(lumpfile);

	// if read less bytes than expected, 
	if (readlen != len)
	{
		// diagnose and return error
		free(readbuf);
		fprintf(stderr, "Unable to read %s\n", file->path);
		return 1;
	}
	// file loaded

	file->uncompressed_size = len;
	file->compressed_size = len;
	file->method = METHOD_STORED;

	// Calculate CRC32 for file.
	crc = crc32(0, NULL, 0);
	crc = crc32(crc, readbuf, (uInt)len);
	file->crc32 = LittleLong(crc);

	// Can we save time and just copy the file from the old zip?
	if (odir != NULL && ozip != NULL)
	{
		CentralDirectoryEntry *dirent;

		dirent = find_file_in_zip(odir, filep->path_in_zip, len, crc, file->date, file->time);
		if (dirent != NULL)
		{
			i = copy_zip_file(zip_file, file, ozip, dirent);
			if (i > 0)
			{
				free(readbuf);
				return 0;
			}
			if (i < 0)
			{
				free(readbuf);
				fprintf(stderr, "Unable to write %s to zip\n", file->path);
				return 1;
			}
		}
	}

	if (!Quiet)
	{
		if (ozip != NULL)
		{
			printf("Updating %-40s", filep->path_in_zip);
		}
		else
		{
			printf("Adding %-40s", filep->path_in_zip);
		}
	}
	UpdateCount++;

	// Allocate a buffer for compression, one byte less than the source buffer.
	// If it doesn't fit in that space, then skip compression and store it as-is.
	compbuf[0] = malloc(len - 1);
	compbuf[1] = malloc(len - 1);
	best = -1;	// best slot
	slot = 0;	// slot we are compressing to now

	// Find best compression method. We have two output buffers. One to hold the
	// best compression method, and the other to hold the compression we are trying
	// now.
	for (i = 0; Compressors[i].compress != NULL; ++i)
	{
		if (DeflateOnly && Compressors[i].method != METHOD_DEFLATE)
		{
			continue;
		}
		comp_len[slot] = len - 1;
		method[slot] = Compressors[i].method;
		offset[slot] = Compressors[i].compress(compbuf[slot], &comp_len[slot], readbuf, len);
		if (offset[slot] >= 0)
		{
			if (best < 0 || comp_len[slot] <= comp_len[best])
			{
				best = slot;
				slot ^= 1;
			}
		}
	}

	if (best >= 0)
	{
		file->method = method[best];
		file->compressed_size = comp_len[best];
	}
//	printf("%s -> method %d -> slot %d\n", filep->path_in_zip, file->method, best);

	// Fill in local directory header.
	local.Magic = ZIP_LOCALFILE;
	local.VersionToExtract[0] = method_to_version(file->method);
	local.VersionToExtract[1] = 0;
	local.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	local.Method = LittleShort(file->method);
	local.ModTime = file->time;
	local.ModDate = file->date;
	local.CRC32 = file->crc32;
	local.UncompressedSize = LittleLong(file->uncompressed_size);
	local.CompressedSize = LittleLong(file->compressed_size);
	local.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	local.ExtraLength = 0;

	file->zip_offset = ftell(zip_file);

	// Write out the header, file name, and file data.
	if (fwrite(&local, sizeof(local), 1, zip_file) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip_file) != 1 ||
		(file->method ? fwrite(compbuf[best] + offset[best], 1, comp_len[best], zip_file) != comp_len[best] :
						fwrite(readbuf, 1, len, zip_file) != len))
	{
		if (!Quiet)
		{
			printf("\n");
		}
		fprintf(stderr, "Unable to write %s to zip\n", file->path);
		free(readbuf);
		if (compbuf[0] != NULL)
		{
			free(compbuf[0]);
		}
		if (compbuf[1] != NULL)
		{
			free(compbuf[1]);
		}
		return 1;
	}

	// all done
	free(readbuf);
	if (compbuf[0] != NULL)
	{
		free(compbuf[0]);
	}
	if (compbuf[1] != NULL)
	{
		free(compbuf[1]);
	}
	if (!Quiet)
	{
		printf("%5.1f%% [%6u/%6u] %s\n", 100.0 - 100.0 * file->compressed_size / file->uncompressed_size,
			file->compressed_size, file->uncompressed_size, method_name(file->method));
	}
	return 0;
}